

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

roaring_bitmap_t * roaring_bitmap_copy(roaring_bitmap_t *r)

{
  _Bool _Var1;
  roaring_array_t *new_ra;
  
  new_ra = (roaring_array_t *)roaring_malloc(0x28);
  if (new_ra != (roaring_array_t *)0x0) {
    _Var1 = ra_init_with_capacity(new_ra,(r->high_low_container).size);
    if (_Var1) {
      _Var1 = ra_overwrite(&r->high_low_container,new_ra,(_Bool)((r->high_low_container).flags & 1))
      ;
      if (_Var1) {
        new_ra->flags = new_ra->flags & 0xfe | (r->high_low_container).flags & 1;
        return (roaring_bitmap_t *)new_ra;
      }
      roaring_bitmap_free((roaring_bitmap_t *)new_ra);
    }
    else {
      roaring_free(new_ra);
    }
  }
  return (roaring_bitmap_t *)0x0;
}

Assistant:

roaring_bitmap_t *roaring_bitmap_copy(const roaring_bitmap_t *r) {
    roaring_bitmap_t *ans =
        (roaring_bitmap_t *)roaring_malloc(sizeof(roaring_bitmap_t));
    if (!ans) {
        return NULL;
    }
    if (!ra_init_with_capacity(  // allocation of list of containers can fail
            &ans->high_low_container, r->high_low_container.size)) {
        roaring_free(ans);
        return NULL;
    }
    if (!ra_overwrite(  // memory allocation of individual containers may fail
            &r->high_low_container, &ans->high_low_container, is_cow(r))) {
        roaring_bitmap_free(ans);  // overwrite should leave in freeable state
        return NULL;
    }
    roaring_bitmap_set_copy_on_write(ans, is_cow(r));
    return ans;
}